

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O0

bool __thiscall
draco::SequentialAttributeDecodersController::DecodeAttributesDecoderData
          (SequentialAttributeDecodersController *this,DecoderBuffer *buffer)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  DecoderBuffer *in_RDI;
  uint8_t decoder_type;
  int i;
  int32_t num_attributes;
  DecoderBuffer *in_stack_000000a0;
  AttributesDecoder *in_stack_000000a8;
  pointer in_stack_ffffffffffffffb8;
  unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
  *in_stack_ffffffffffffffc0;
  undefined1 local_30 [8];
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  bool local_1;
  
  bVar1 = AttributesDecoder::DecodeAttributesDecoderData(in_stack_000000a8,in_stack_000000a0);
  if (bVar1) {
    iVar2 = (**(code **)(in_RDI->data_ + 0x30))();
    std::
    vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
    ::resize((vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
              *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
             CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
      bVar1 = DecoderBuffer::Decode<unsigned_char>(in_RDI,(uchar *)in_stack_ffffffffffffffc0);
      if (!bVar1) {
        return false;
      }
      (**(code **)(in_RDI->data_ + 0x60))(local_30,in_RDI,in_stack_ffffffffffffffdf);
      std::
      vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
      ::operator[]((vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
                    *)&in_RDI[1].pos_,(long)iVar4);
      std::
      unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
      ::operator=(in_stack_ffffffffffffffc0,
                  (unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                   *)in_stack_ffffffffffffffb8);
      std::
      unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
      ::~unique_ptr(in_stack_ffffffffffffffc0);
      std::
      vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
      ::operator[]((vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
                    *)&in_RDI[1].pos_,(long)iVar4);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                          *)0x207ed1);
      if (!bVar1) {
        return false;
      }
      std::
      vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
      ::operator[]((vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
                    *)&in_RDI[1].pos_,(long)iVar4);
      in_stack_ffffffffffffffb8 =
           std::
           unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
           ::operator->((unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                         *)0x207ef7);
      in_stack_ffffffffffffffc0 =
           (unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
            *)(**(code **)(in_RDI->data_ + 0x38))();
      uVar3 = (**(code **)(in_RDI->data_ + 0x28))(in_RDI,iVar4);
      uVar3 = (*in_stack_ffffffffffffffb8->_vptr_SequentialAttributeDecoder[2])
                        (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,(ulong)uVar3);
      if ((uVar3 & 1) == 0) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SequentialAttributeDecodersController::DecodeAttributesDecoderData(
    DecoderBuffer *buffer) {
  if (!AttributesDecoder::DecodeAttributesDecoderData(buffer)) {
    return false;
  }
  // Decode unique ids of all sequential encoders and create them.
  const int32_t num_attributes = GetNumAttributes();
  sequential_decoders_.resize(num_attributes);
  for (int i = 0; i < num_attributes; ++i) {
    uint8_t decoder_type;
    if (!buffer->Decode(&decoder_type)) {
      return false;
    }
    // Create the decoder from the id.
    sequential_decoders_[i] = CreateSequentialDecoder(decoder_type);
    if (!sequential_decoders_[i]) {
      return false;
    }
    if (!sequential_decoders_[i]->Init(GetDecoder(), GetAttributeId(i))) {
      return false;
    }
  }
  return true;
}